

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v9::detail::report_error(format_func func,int error_code,char *message)

{
  buffer<char> local_220;
  char local_200 [504];
  
  local_220.ptr_ = local_200;
  local_220.size_ = 0;
  local_220._vptr_buffer = (_func_int **)&PTR_grow_004e96c0;
  local_220.capacity_ = 500;
  (*func)(&local_220,error_code,message);
  report_error();
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}